

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

v128 __thiscall wabt::interp::Istream::ReadAt<v128>(Istream *this,Offset *offset)

{
  uint uVar1;
  uint8_t auVar2 [16];
  size_type sVar3;
  uchar *puVar4;
  Offset *offset_local;
  Istream *this_local;
  v128 result;
  
  uVar1 = *offset;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
  if ((ulong)uVar1 + 0x10 <= sVar3) {
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data_);
    auVar2 = *(uint8_t (*) [16])(puVar4 + *offset);
    *offset = *offset + 0x10;
    return (v128)auVar2;
  }
  __assert_fail("*offset + sizeof(T) <= data_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/istream.cc"
                ,0x62,"T wabt::interp::Istream::ReadAt(Offset *) const [T = v128]");
}

Assistant:

T WABT_VECTORCALL Istream::ReadAt(Offset* offset) const {
  assert(*offset + sizeof(T) <= data_.size());
  T result;
  memcpy(&result, data_.data() + *offset, sizeof(T));
  *offset += sizeof(T);
  return result;
}